

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O2

char * c_escape(char *str,curl_off_t len)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  ushort **ppuVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  byte *pbVar8;
  
  if (len == -1) {
    len = strlen(str);
  }
  sVar6 = 2000;
  if (len < 2000) {
    sVar6 = len;
  }
  uVar2 = (uint)(2000 < len) * 3;
  pbVar3 = (byte *)malloc((ulong)uVar2 + sVar6 * 4 + 1);
  if (pbVar3 != (byte *)0x0) {
    pbVar8 = pbVar3;
    for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
      bVar1 = str[sVar7];
      if (bVar1 == 9) {
        pbVar8[2] = 0;
        pbVar8[0] = 0x5c;
        pbVar8[1] = 0x74;
LAB_0011bc66:
        pbVar8 = pbVar8 + 2;
      }
      else {
        if (bVar1 == 0x5c) {
          pbVar8[2] = 0;
          pbVar8[0] = 0x5c;
          pbVar8[1] = 0x5c;
          goto LAB_0011bc66;
        }
        if (bVar1 == 0xd) {
          pbVar8[2] = 0;
          pbVar8[0] = 0x5c;
          pbVar8[1] = 0x72;
          goto LAB_0011bc66;
        }
        if (bVar1 == 0x22) {
          pbVar8[2] = 0;
          pbVar8[0] = 0x5c;
          pbVar8[1] = 0x22;
          goto LAB_0011bc66;
        }
        if (bVar1 == 10) {
          pbVar8[2] = 0;
          pbVar8[0] = 0x5c;
          pbVar8[1] = 0x6e;
          goto LAB_0011bc66;
        }
        ppuVar4 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x40) == 0) {
          curl_msnprintf(pbVar8,5,"\\x%02x");
          pbVar8 = pbVar8 + 4;
        }
        else {
          *pbVar8 = bVar1;
          pbVar8 = pbVar8 + 1;
        }
      }
    }
    for (lVar5 = 0; uVar2 != (uint)lVar5; lVar5 = lVar5 + 1) {
      pbVar8[lVar5] = 0x2e;
    }
    pbVar8[lVar5] = 0;
  }
  return (char *)pbVar3;
}

Assistant:

static char *c_escape(const char *str, curl_off_t len)
{
  const char *s;
  unsigned char c;
  char *escaped, *e;
  unsigned int cutoff = 0;

  if(len == ZERO_TERMINATED)
    len = strlen(str);

  if(len > MAX_STRING_LENGTH_OUTPUT) {
    /* cap ridiculously long strings */
    len = MAX_STRING_LENGTH_OUTPUT;
    cutoff = 3;
  }

  /* Allocate space based on worst-case */
  escaped = malloc(4 * (size_t)len + 1 + cutoff);
  if(!escaped)
    return NULL;

  e = escaped;
  for(s = str; len; s++, len--) {
    c = *s;
    if(c == '\n') {
      strcpy(e, "\\n");
      e += 2;
    }
    else if(c == '\r') {
      strcpy(e, "\\r");
      e += 2;
    }
    else if(c == '\t') {
      strcpy(e, "\\t");
      e += 2;
    }
    else if(c == '\\') {
      strcpy(e, "\\\\");
      e += 2;
    }
    else if(c == '"') {
      strcpy(e, "\\\"");
      e += 2;
    }
    else if(!isprint(c)) {
      msnprintf(e, 5, "\\x%02x", (unsigned)c);
      e += 4;
    }
    else
      *e++ = c;
  }
  while(cutoff--)
    *e++ = '.';
  *e = '\0';
  return escaped;
}